

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uconv.h
# Opt level: O1

void __thiscall
booster::locale::impl_icu::icu_std_converter<char,_1>::uconv::uconv
          (uconv *this,string *charset,cpcvt_type cvt_type)

{
  pointer pcVar1;
  int iVar2;
  UConverter *pUVar3;
  runtime_error *prVar4;
  char *pcVar5;
  invalid_charset_error *this_00;
  UErrorCode err;
  allocator local_65;
  int local_64;
  string local_60;
  string local_40;
  
  local_64 = 0;
  pUVar3 = (UConverter *)ucnv_open_70((charset->_M_dataplus)._M_p);
  this->cvt_ = pUVar3;
  if (pUVar3 != (UConverter *)0x0) {
    if (local_64 < 1) {
      if (cvt_type == cvt_skip) {
        ucnv_setFromUCallBack_70(pUVar3,UCNV_FROM_U_CALLBACK_SKIP_70,0,0,0,&local_64);
        iVar2 = local_64;
        if (0 < local_64) {
          prVar4 = (runtime_error *)__cxa_allocate_exception(0x30);
          pcVar5 = (char *)u_errorName_70(iVar2);
          ::std::__cxx11::string::string((string *)&local_60,pcVar5,&local_65);
          runtime_error::runtime_error(prVar4,&local_60);
          __cxa_throw(prVar4,&runtime_error::typeinfo,runtime_error::~runtime_error);
        }
        local_64 = 0;
        ucnv_setToUCallBack_70(this->cvt_,UCNV_TO_U_CALLBACK_SKIP_70,0,0,0);
        iVar2 = local_64;
        if (0 < local_64) {
          prVar4 = (runtime_error *)__cxa_allocate_exception(0x30);
          pcVar5 = (char *)u_errorName_70(iVar2);
          ::std::__cxx11::string::string((string *)&local_60,pcVar5,&local_65);
          runtime_error::runtime_error(prVar4,&local_60);
          __cxa_throw(prVar4,&runtime_error::typeinfo,runtime_error::~runtime_error);
        }
      }
      else {
        ucnv_setFromUCallBack_70(pUVar3,UCNV_FROM_U_CALLBACK_STOP_70,0,0,0,&local_64);
        iVar2 = local_64;
        if (0 < local_64) {
          prVar4 = (runtime_error *)__cxa_allocate_exception(0x30);
          pcVar5 = (char *)u_errorName_70(iVar2);
          ::std::__cxx11::string::string((string *)&local_60,pcVar5,&local_65);
          runtime_error::runtime_error(prVar4,&local_60);
          __cxa_throw(prVar4,&runtime_error::typeinfo,runtime_error::~runtime_error);
        }
        local_64 = 0;
        ucnv_setToUCallBack_70(this->cvt_,UCNV_TO_U_CALLBACK_STOP_70,0,0,0);
        iVar2 = local_64;
        if (0 < local_64) {
          prVar4 = (runtime_error *)__cxa_allocate_exception(0x30);
          pcVar5 = (char *)u_errorName_70(iVar2);
          ::std::__cxx11::string::string((string *)&local_60,pcVar5,&local_65);
          runtime_error::runtime_error(prVar4,&local_60);
          __cxa_throw(prVar4,&runtime_error::typeinfo,runtime_error::~runtime_error);
        }
      }
      return;
    }
    if (pUVar3 != (UConverter *)0x0) {
      ucnv_close_70(pUVar3);
    }
  }
  this_00 = (invalid_charset_error *)__cxa_allocate_exception(0x30);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  pcVar1 = (charset->_M_dataplus)._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_40,pcVar1,pcVar1 + charset->_M_string_length);
  conv::invalid_charset_error::invalid_charset_error(this_00,&local_40);
  __cxa_throw(this_00,&conv::invalid_charset_error::typeinfo,runtime_error::~runtime_error);
}

Assistant:

uconv(std::string const &charset,cpcvt_type cvt_type=cvt_skip) 
            {
                UErrorCode err=U_ZERO_ERROR;
                cvt_ = ucnv_open(charset.c_str(),&err);
                if(!cvt_ || U_FAILURE(err)) {
                    if(cvt_)
                        ucnv_close(cvt_);
                    throw conv::invalid_charset_error(charset);
                }
                
                try {
                    if(cvt_type==cvt_skip) {
                        ucnv_setFromUCallBack(cvt_,UCNV_FROM_U_CALLBACK_SKIP,0,0,0,&err);
                        check_and_throw_icu_error(err);
                
                        err=U_ZERO_ERROR;
                        ucnv_setToUCallBack(cvt_,UCNV_TO_U_CALLBACK_SKIP,0,0,0,&err);
                        check_and_throw_icu_error(err);
                    }
                    else {
                        ucnv_setFromUCallBack(cvt_,UCNV_FROM_U_CALLBACK_STOP,0,0,0,&err);
                        check_and_throw_icu_error(err);
                
                        err=U_ZERO_ERROR;
                        ucnv_setToUCallBack(cvt_,UCNV_TO_U_CALLBACK_STOP,0,0,0,&err);
                        check_and_throw_icu_error(err);
                    }
                }
                catch(...) { ucnv_close(cvt_) ; throw; }
            }